

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

uint64_t dtl_sv_to_u64(dtl_sv_t *self,_Bool *ok)

{
  float fVar1;
  double dVar2;
  dtl_sv_type_id dVar3;
  ulong local_28;
  uint64_t retval;
  _Bool success;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  retval._7_1_ = false;
  local_28 = 0;
  if (self != (dtl_sv_t *)0x0) {
    dVar3 = dtl_sv_type(self);
    switch(dVar3) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
      retval._7_1_ = -1 < (self->pAny->val).i32;
      if (retval._7_1_) {
        local_28 = (ulong)(self->pAny->val).i32;
      }
      break;
    case DTL_SV_U32:
      local_28 = (ulong)(self->pAny->val).u32;
      retval._7_1_ = true;
      break;
    case DTL_SV_I64:
      retval._7_1_ = -1 < (self->pAny->val).i32;
      if (retval._7_1_) {
        local_28 = (self->pAny->val).i64;
      }
      break;
    case DTL_SV_U64:
      local_28 = (self->pAny->val).i64;
      retval._7_1_ = true;
      break;
    case DTL_SV_FLT:
      retval._7_1_ = 0.0 <= (self->pAny->val).flt;
      if (retval._7_1_) {
        fVar1 = (self->pAny->val).flt;
        local_28 = (ulong)fVar1;
        local_28 = local_28 | (long)(fVar1 - 9.223372e+18) & (long)local_28 >> 0x3f;
      }
      break;
    case DTL_SV_DBL:
      retval._7_1_ = 0.0 <= (self->pAny->val).dbl;
      if (retval._7_1_) {
        dVar2 = (self->pAny->val).dbl;
        local_28 = (ulong)dVar2;
        local_28 = local_28 | (long)(dVar2 - 9.223372036854776e+18) & (long)local_28 >> 0x3f;
      }
      break;
    case DTL_SV_CHAR:
      local_28 = (ulong)(self->pAny->val).cr;
      retval._7_1_ = true;
      break;
    case DTL_SV_BOOL:
      local_28 = (ulong)((self->pAny->val).cr & 1);
      retval._7_1_ = true;
      break;
    case DTL_SV_STR:
      break;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
      break;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  if (ok != (_Bool *)0x0) {
    *ok = retval._7_1_;
  }
  return local_28;
}

Assistant:

uint64_t dtl_sv_to_u64(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   uint64_t retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         if (self->pAny->val.i32 >= 0)
         {
            retval = (uint64_t)self->pAny->val.i32;
            success = true;
         }
         break;         break;
      case DTL_SV_U32:
         retval = (uint64_t) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         if (self->pAny->val.i32 >= 0)
         {
            retval = (uint64_t)self->pAny->val.i64;
            success = true;
         }
         break;         break;
      case DTL_SV_U64:
         retval = self->pAny->val.u64;
         success = true;
         break;
      case DTL_SV_FLT:
         if (self->pAny->val.flt >= 0.0)
         {
            retval = (uint64_t)self->pAny->val.flt;
            success = true;
         }
         break;
      case DTL_SV_DBL:
         if (self->pAny->val.dbl >= 0.0)
         {
            retval = (uint64_t)self->pAny->val.dbl;
            success = true;
         }
         break;
      case DTL_SV_BOOL:
         retval = (uint64_t) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (uint64_t)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}